

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::ModelDescription::ByteSizeLong(ModelDescription *this)

{
  Rep *pRVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  void **ppvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar9 = (long)(this->input_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  if (lVar9 == 0) {
    lVar9 = 0;
  }
  else {
    lVar10 = lVar9 * 8;
    lVar8 = 0;
    do {
      sVar5 = FeatureDescription::ByteSizeLong(*(FeatureDescription **)((long)ppvVar7 + lVar8));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar9 = lVar9 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar10 - lVar8 != 0);
  }
  lVar10 = (long)(this->output_).super_RepeatedPtrFieldBase.current_size_;
  lVar9 = lVar9 + lVar10;
  pRVar1 = (this->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  if (lVar10 != 0) {
    lVar8 = 0;
    do {
      sVar5 = FeatureDescription::ByteSizeLong(*(FeatureDescription **)((long)ppvVar7 + lVar8));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar9 = lVar9 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar10 * 8 != lVar8);
  }
  lVar10 = (long)(this->state_).super_RepeatedPtrFieldBase.current_size_;
  lVar9 = lVar9 + lVar10;
  pRVar1 = (this->state_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  if (lVar10 != 0) {
    lVar8 = 0;
    do {
      sVar5 = FeatureDescription::ByteSizeLong(*(FeatureDescription **)((long)ppvVar7 + lVar8));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar9 = lVar9 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar10 * 8 != lVar8);
  }
  lVar10 = (long)(this->functions_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->functions_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  lVar9 = lVar9 + lVar10 * 2;
  if (lVar10 != 0) {
    lVar8 = 0;
    do {
      sVar5 = FunctionDescription::ByteSizeLong(*(FunctionDescription **)((long)ppvVar7 + lVar8));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar9 = lVar9 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar10 * 8 != lVar8);
  }
  lVar10 = (long)(this->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->traininginput_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  sVar5 = lVar9 + lVar10 * 2;
  if (lVar10 != 0) {
    lVar9 = 0;
    do {
      sVar6 = FeatureDescription::ByteSizeLong(*(FeatureDescription **)((long)ppvVar7 + lVar9));
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar9 = lVar9 + 8;
    } while (lVar10 * 8 != lVar9);
  }
  lVar9 = *(long *)(((ulong)(this->predictedfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8
                   );
  if (lVar9 != 0) {
    uVar4 = (uint)lVar9 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar5 = sVar5 + lVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  lVar9 = *(long *)(((ulong)(this->predictedprobabilitiesname_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar9 != 0) {
    uVar4 = (uint)lVar9 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar5 = sVar5 + lVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  lVar9 = *(long *)(((ulong)(this->defaultfunctionname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8)
  ;
  if (lVar9 != 0) {
    uVar4 = (uint)lVar9 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar5 = sVar5 + lVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  if (this->metadata_ != (Metadata *)0x0 &&
      this != (ModelDescription *)&_ModelDescription_default_instance_) {
    sVar6 = Metadata::ByteSizeLong(this->metadata_);
    uVar4 = (uint)sVar6 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar5 = sVar5 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t ModelDescription::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ModelDescription)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.FeatureDescription input = 1;
  total_size += 1UL * this->_internal_input_size();
  for (const auto& msg : this->input_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription output = 10;
  total_size += 1UL * this->_internal_output_size();
  for (const auto& msg : this->output_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription state = 13;
  total_size += 1UL * this->_internal_state_size();
  for (const auto& msg : this->state_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FunctionDescription functions = 20;
  total_size += 2UL * this->_internal_functions_size();
  for (const auto& msg : this->functions_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription trainingInput = 50;
  total_size += 2UL * this->_internal_traininginput_size();
  for (const auto& msg : this->traininginput_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string predictedFeatureName = 11;
  if (!this->_internal_predictedfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_predictedfeaturename());
  }

  // string predictedProbabilitiesName = 12;
  if (!this->_internal_predictedprobabilitiesname().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_predictedprobabilitiesname());
  }

  // string defaultFunctionName = 21;
  if (!this->_internal_defaultfunctionname().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_defaultfunctionname());
  }

  // .CoreML.Specification.Metadata metadata = 100;
  if (this->_internal_has_metadata()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *metadata_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}